

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

uint __thiscall jpgd::jpeg_decoder::get_bits(jpeg_decoder *this,int num_bits)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (num_bits == 0) {
    uVar6 = 0;
  }
  else {
    uVar7 = this->m_bit_buf;
    uVar6 = uVar7 >> (-(byte)num_bits & 0x1f);
    iVar2 = this->m_bits_left;
    this->m_bits_left = iVar2 - num_bits;
    if (iVar2 - num_bits == 0 || iVar2 < num_bits) {
      this->m_bit_buf = uVar7 << ((byte)iVar2 & 0x1f);
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar5 = this->m_tem_flag;
        this->m_tem_flag = uVar5 ^ 1;
        uVar7 = 0xd9;
        if (uVar5 == 0) {
          uVar7 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        bVar1 = *pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
        uVar7 = (uint)bVar1;
      }
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar3 = this->m_tem_flag;
        this->m_tem_flag = uVar3 ^ 1;
        uVar5 = 0xd9;
        if (uVar3 == 0) {
          uVar5 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        uVar5 = (uint)*pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      iVar2 = this->m_bits_left;
      this->m_bit_buf =
           (uVar7 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar5) <<
           (-(char)iVar2 & 0x1fU);
      this->m_bits_left = iVar2 + 0x10;
      if (iVar2 < -0x10) {
        __assert_fail("m_bits_left >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                      ,0x1be,"uint jpgd::jpeg_decoder::get_bits(int)");
      }
    }
    else {
      this->m_bit_buf = uVar7 << ((byte)num_bits & 0x1f);
    }
  }
  return uVar6;
}

Assistant:

inline uint jpeg_decoder::get_bits(int num_bits)
{
  if (!num_bits)
    return 0;

  uint i = m_bit_buf >> (32 - num_bits);

  if ((m_bits_left -= num_bits) <= 0)
  {
    m_bit_buf <<= (num_bits += m_bits_left);

    uint c1 = get_char();
    uint c2 = get_char();
    m_bit_buf = (m_bit_buf & 0xFFFF0000) | (c1 << 8) | c2;

    m_bit_buf <<= -m_bits_left;

    m_bits_left += 16;

    JPGD_ASSERT(m_bits_left >= 0);
  }
  else
    m_bit_buf <<= num_bits;

  return i;
}